

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O1

void __thiscall
HighsLinearSumBounds::shrink
          (HighsLinearSumBounds *this,vector<int,_std::allocator<int>_> *newIndices,HighsInt newSize
          )

{
  double *pdVar1;
  pointer pHVar2;
  pointer piVar3;
  pointer piVar4;
  double dVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  size_type __new_size;
  
  uVar6 = (ulong)((long)(newIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(newIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  if ((int)uVar6 != 0) {
    uVar6 = uVar6 & 0xffffffff;
    lVar7 = 0;
    do {
      lVar8 = (long)*(int *)((long)(newIndices->super__Vector_base<int,_std::allocator<int>_>).
                                   _M_impl.super__Vector_impl_data._M_start + lVar7);
      if (lVar8 != -1) {
        pHVar2 = (this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar1 = (double *)((long)&pHVar2->hi + lVar7 * 4);
        dVar5 = pdVar1[1];
        pHVar2 = pHVar2 + lVar8;
        pHVar2->hi = *pdVar1;
        pHVar2->lo = dVar5;
        pHVar2 = (this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar1 = (double *)((long)&pHVar2->hi + lVar7 * 4);
        dVar5 = pdVar1[1];
        pHVar2 = pHVar2 + *(int *)((long)(newIndices->super__Vector_base<int,_std::allocator<int>_>)
                                         ._M_impl.super__Vector_impl_data._M_start + lVar7);
        pHVar2->hi = *pdVar1;
        pHVar2->lo = dVar5;
        piVar3 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = (newIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3[*(int *)((long)piVar4 + lVar7)] = *(int *)((long)piVar3 + lVar7);
        piVar3 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3[*(int *)((long)piVar4 + lVar7)] = *(int *)((long)piVar3 + lVar7);
        pHVar2 = (this->sumLowerOrig).
                 super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar1 = (double *)((long)&pHVar2->hi + lVar7 * 4);
        dVar5 = pdVar1[1];
        pHVar2 = pHVar2 + *(int *)((long)piVar4 + lVar7);
        pHVar2->hi = *pdVar1;
        pHVar2->lo = dVar5;
        pHVar2 = (this->sumUpperOrig).
                 super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar1 = (double *)((long)&pHVar2->hi + lVar7 * 4);
        dVar5 = pdVar1[1];
        pHVar2 = pHVar2 + *(int *)((long)(newIndices->super__Vector_base<int,_std::allocator<int>_>)
                                         ._M_impl.super__Vector_impl_data._M_start + lVar7);
        pHVar2->hi = *pdVar1;
        pHVar2->lo = dVar5;
        piVar3 = (this->numInfSumLowerOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = (newIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3[*(int *)((long)piVar4 + lVar7)] = *(int *)((long)piVar3 + lVar7);
        piVar3 = (this->numInfSumUpperOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3[*(int *)((long)piVar4 + lVar7)] = *(int *)((long)piVar3 + lVar7);
      }
      lVar7 = lVar7 + 4;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  __new_size = (size_type)newSize;
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&this->sumLower,__new_size);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&this->sumUpper,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&this->numInfSumLower,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&this->numInfSumUpper,__new_size);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&this->sumLowerOrig,__new_size);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&this->sumUpperOrig,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&this->numInfSumLowerOrig,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&this->numInfSumUpperOrig,__new_size);
  return;
}

Assistant:

void HighsLinearSumBounds::shrink(const std::vector<HighsInt>& newIndices,
                                  HighsInt newSize) {
  HighsInt oldNumInds = newIndices.size();
  for (HighsInt i = 0; i != oldNumInds; ++i) {
    if (newIndices[i] != -1) {
      sumLower[newIndices[i]] = sumLower[i];
      sumUpper[newIndices[i]] = sumUpper[i];
      numInfSumLower[newIndices[i]] = numInfSumLower[i];
      numInfSumUpper[newIndices[i]] = numInfSumUpper[i];
      sumLowerOrig[newIndices[i]] = sumLowerOrig[i];
      sumUpperOrig[newIndices[i]] = sumUpperOrig[i];
      numInfSumLowerOrig[newIndices[i]] = numInfSumLowerOrig[i];
      numInfSumUpperOrig[newIndices[i]] = numInfSumUpperOrig[i];
    }
  }

  sumLower.resize(newSize);
  sumUpper.resize(newSize);
  numInfSumLower.resize(newSize);
  numInfSumUpper.resize(newSize);
  sumLowerOrig.resize(newSize);
  sumUpperOrig.resize(newSize);
  numInfSumLowerOrig.resize(newSize);
  numInfSumUpperOrig.resize(newSize);
}